

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
          (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *this)

{
  iterator *in_RDI;
  iterator *it;
  
  iterator::iterator(in_RDI,(IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)in_RDI
                    );
  const_iterator::setToEnd((const_iterator *)0x850043);
  return in_RDI;
}

Assistant:

iterator end() {
        iterator it(*this);
        it.setToEnd();
        return it;
    }